

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threewisehash.h
# Opt level: O0

void __thiscall
ThreeWiseHash<unsigned_int,_unsigned_char>::eat
          (ThreeWiseHash<unsigned_int,_unsigned_char> *this,uchar inchar)

{
  uchar local_11;
  ThreeWiseHash<unsigned_int,_unsigned_char> *pTStack_10;
  uchar inchar_local;
  ThreeWiseHash<unsigned_int,_unsigned_char> *this_local;
  
  local_11 = inchar;
  pTStack_10 = this;
  std::deque<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->ngram,&local_11);
  __updateHashValue(this);
  return;
}

Assistant:

void eat(chartype inchar) {
    ngram.push_back(inchar);
    __updateHashValue();
  }